

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

void __thiscall
lodepng::ExtractZlib::inflateHuffmanBlock
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
          size_t *bp,size_t *pos,size_t inlength,unsigned_long btype)

{
  byte bVar1;
  iterator iVar2;
  ulong uVar3;
  long lVar4;
  iterator __position;
  unsigned_long uVar5;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *pvVar6;
  long lVar7;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  long lVar12;
  HuffmanTree *tree;
  long lVar13;
  ulong uVar14;
  int local_9c;
  uchar *local_98;
  long local_90;
  ulong *local_88;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_80;
  long local_78;
  long local_70;
  HuffmanTree *local_68;
  size_t *local_60;
  ExtractZlib *local_58;
  size_t local_50;
  HuffmanTree *local_48;
  unsigned_long local_40;
  long local_38;
  
  local_98 = in;
  local_88 = pos;
  local_80 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out;
  if (btype == 2) {
    getTreeInflateDynamic(this,&this->codetree,&this->codetreeD,in,bp,inlength);
    if (this->error != 0) {
      return;
    }
  }
  else if (btype == 1) {
    generateFixedTrees(this,&this->codetree,&this->codetreeD);
  }
  tree = &this->codetree;
  uVar5 = huffmanDecodeSymbol(this,local_98,bp,tree,inlength);
  if (this->error == 0) {
    local_48 = &this->codetreeD;
    local_70 = 0;
    local_78 = 0;
    local_68 = tree;
    local_60 = bp;
    local_58 = this;
    local_50 = inlength;
    do {
      pvVar6 = this->zlibinfo;
      lVar9 = *(long *)(pvVar6 + 8);
      local_9c = (int)uVar5;
      iVar2._M_current = *(int **)(lVar9 + -0x98);
      if (iVar2._M_current == *(int **)(lVar9 + -0x90)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(lVar9 + -0xa0),iVar2,&local_9c);
        pvVar6 = this->zlibinfo;
      }
      else {
        *iVar2._M_current = local_9c;
        *(int **)(lVar9 + -0x98) = iVar2._M_current + 1;
      }
      lVar9 = *(long *)(pvVar6 + 8);
      local_9c = 0;
      iVar2._M_current = *(int **)(lVar9 + -0x80);
      if (iVar2._M_current == *(int **)(lVar9 + -0x78)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(lVar9 + -0x88),iVar2,&local_9c);
        pvVar6 = this->zlibinfo;
      }
      else {
        *iVar2._M_current = 0;
        *(int **)(lVar9 + -0x80) = iVar2._M_current + 1;
      }
      lVar9 = *(long *)(pvVar6 + 8);
      local_9c = 0;
      iVar2._M_current = *(int **)(lVar9 + -0x68);
      if (iVar2._M_current == *(int **)(lVar9 + -0x60)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(lVar9 + -0x70),iVar2,&local_9c);
        pvVar6 = this->zlibinfo;
      }
      else {
        *iVar2._M_current = 0;
        *(int **)(lVar9 + -0x68) = iVar2._M_current + 1;
      }
      lVar9 = *(long *)(pvVar6 + 8);
      local_9c = 0;
      iVar2._M_current = *(int **)(lVar9 + -0x50);
      if (iVar2._M_current == *(int **)(lVar9 + -0x48)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(lVar9 + -0x58),iVar2,&local_9c);
        pvVar6 = this->zlibinfo;
      }
      else {
        *iVar2._M_current = 0;
        *(int **)(lVar9 + -0x50) = iVar2._M_current + 1;
      }
      lVar9 = *(long *)(pvVar6 + 8);
      local_9c = 0;
      iVar2._M_current = *(int **)(lVar9 + -0x38);
      if (iVar2._M_current == *(int **)(lVar9 + -0x30)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(lVar9 + -0x40),iVar2,&local_9c);
        pvVar6 = this->zlibinfo;
      }
      else {
        *iVar2._M_current = 0;
        *(int **)(lVar9 + -0x38) = iVar2._M_current + 1;
      }
      lVar9 = *(long *)(pvVar6 + 8);
      local_9c = 0;
      iVar2._M_current = *(int **)(lVar9 + -0x20);
      if (iVar2._M_current == *(int **)(lVar9 + -0x18)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(lVar9 + -0x28),iVar2,&local_9c);
      }
      else {
        *iVar2._M_current = 0;
        *(int **)(lVar9 + -0x20) = iVar2._M_current + 1;
      }
      if (uVar5 == 0x100) {
        lVar9 = *(long *)(this->zlibinfo + 8);
        *(long *)(lVar9 + -0x10) = local_70;
        *(long *)(lVar9 + -8) = local_78;
        return;
      }
      if (uVar5 < 0x100) {
        local_9c = CONCAT31(local_9c._1_3_,(char)uVar5);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                   (uchar *)&local_9c);
        *local_88 = *local_88 + 1;
        local_70 = local_70 + 1;
      }
      else if (uVar5 < 0x11e) {
        uVar3 = *bp;
        if (inlength <= uVar3 >> 3) {
LAB_0011fb68:
          this->error = 0x33;
          return;
        }
        local_38 = *(long *)(
                            "invalid filter strategy given for LodePNGEncoderSettings.filter_strategy"
                            + uVar5 * 8 + 8);
        local_90 = *(long *)(
                            "color conversion to palette requested while a color isn\'t in palette, or index out of bounds"
                            + uVar5 * 8 + 0x4b);
        if (uVar5 - 0x11d < 0xffffffffffffffec) {
          lVar13 = 0;
        }
        else {
          lVar9 = 0;
          lVar13 = 0;
          do {
            bVar1 = local_98[uVar3 + lVar9 >> 3];
            *bp = uVar3 + 1 + lVar9;
            lVar13 = lVar13 + ((ulong)((bVar1 >> ((uint)(uVar3 + lVar9) & 7) & 1) != 0) <<
                              ((byte)lVar9 & 0x3f));
            lVar9 = lVar9 + 1;
          } while (local_38 != lVar9);
        }
        local_40 = huffmanDecodeSymbol(this,local_98,bp,local_48,inlength);
        if (this->error != 0) {
          return;
        }
        if (0x1d < local_40) {
          this->error = 0x12;
          return;
        }
        uVar3 = *bp;
        if (inlength <= uVar3 >> 3) goto LAB_0011fb68;
        lVar9 = *(long *)(DISTEXTRA + local_40 * 8);
        lVar4 = *(long *)(DISTBASE + local_40 * 8);
        if (local_40 < 4) {
          lVar12 = 0;
        }
        else {
          lVar7 = 0;
          lVar12 = 0;
          do {
            bVar1 = local_98[uVar3 + lVar7 >> 3];
            *bp = uVar3 + 1 + lVar7;
            lVar12 = lVar12 + ((ulong)((bVar1 >> ((uint)(uVar3 + lVar7) & 7) & 1) != 0) <<
                              ((byte)lVar7 & 0x3f));
            lVar7 = lVar7 + 1;
          } while (lVar9 != lVar7);
        }
        lVar13 = lVar13 + local_90;
        local_90 = lVar9;
        if (lVar13 != 0) {
          uVar3 = *local_88;
          uVar14 = uVar3 - (lVar12 + lVar4);
          pvVar8 = local_80;
          lVar9 = lVar13;
          puVar10 = local_88;
          uVar11 = uVar14;
          do {
            __position._M_current = *(uchar **)(pvVar8 + 8);
            if (__position._M_current == *(uchar **)(pvVar8 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        (local_80,__position,(uchar *)(*(long *)pvVar8 + uVar11));
              pvVar8 = local_80;
              puVar10 = local_88;
            }
            else {
              *__position._M_current = *(uchar *)(*(long *)pvVar8 + uVar11);
              *(pointer *)(pvVar8 + 8) = *(pointer *)(pvVar8 + 8) + 1;
            }
            uVar11 = uVar11 + 1;
            *puVar10 = *puVar10 + 1;
            if (uVar3 <= uVar11) {
              uVar11 = uVar14;
            }
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        local_78 = local_78 + 1;
        lVar9 = *(long *)(local_58->zlibinfo + 8);
        *(int *)(*(long *)(lVar9 + -0x80) + -4) = (int)local_40;
        *(int *)(*(long *)(lVar9 + -0x68) + -4) = (int)local_38;
        *(int *)(*(long *)(lVar9 + -0x50) + -4) = (int)local_90;
        *(int *)(*(long *)(lVar9 + -0x38) + -4) = (int)lVar13;
        *(int *)(*(long *)(lVar9 + -0x20) + -4) = (int)(lVar12 + lVar4);
        bp = local_60;
        this = local_58;
        tree = local_68;
        inlength = local_50;
      }
      uVar5 = huffmanDecodeSymbol(this,local_98,bp,tree,inlength);
    } while (this->error == 0);
  }
  return;
}

Assistant:

void inflateHuffmanBlock(std::vector<unsigned char>& out,
                           const unsigned char* in, size_t& bp, size_t& pos, size_t inlength, unsigned long btype) {
    size_t numcodes = 0, numlit = 0, numlen = 0; //for logging
    if(btype == 1) { generateFixedTrees(codetree, codetreeD); }
    else if(btype == 2) { getTreeInflateDynamic(codetree, codetreeD, in, bp, inlength); if(error) return; }
    for(;;) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codetree, inlength); if(error) return;
      numcodes++;
      zlibinfo->back().lz77_lcode.push_back(code); //output code
      zlibinfo->back().lz77_dcode.push_back(0);
      zlibinfo->back().lz77_lbits.push_back(0);
      zlibinfo->back().lz77_dbits.push_back(0);
      zlibinfo->back().lz77_lvalue.push_back(0);
      zlibinfo->back().lz77_dvalue.push_back(0);

      if(code == 256) {
        break; //end code
      } else if(code <= 255) { //literal symbol
        out.push_back((unsigned char)(code));
        pos++;
        numlit++;
      } else if(code >= 257 && code <= 285) { //length code
        size_t length = LENBASE[code - 257], numextrabits = LENEXTRA[code - 257];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        length += readBitsFromStream(bp, in, numextrabits);
        unsigned long codeD = huffmanDecodeSymbol(in, bp, codetreeD, inlength); if(error) return;
        if(codeD > 29) { error = 18; return; } //error: invalid dist code (30-31 are never used)
        unsigned long dist = DISTBASE[codeD], numextrabitsD = DISTEXTRA[codeD];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        dist += readBitsFromStream(bp, in, numextrabitsD);
        size_t start = pos, back = start - dist; //backwards
        for(size_t i = 0; i < length; i++) {
          out.push_back(out[back++]);
          pos++;
          if(back >= start) back = start - dist;
        }
        numlen++;
        zlibinfo->back().lz77_dcode.back() = codeD; //output distance code
        zlibinfo->back().lz77_lbits.back() = numextrabits; //output length extra bits
        zlibinfo->back().lz77_dbits.back() = numextrabitsD; //output dist extra bits
        zlibinfo->back().lz77_lvalue.back() = length; //output length
        zlibinfo->back().lz77_dvalue.back() = dist; //output dist
      }
    }
    zlibinfo->back().numlit = numlit; //output number of literal symbols
    zlibinfo->back().numlen = numlen; //output number of length symbols
  }